

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_address.cpp
# Opt level: O1

void __thiscall
Address_NoSegwitAddressFromStringTest_Test::TestBody
          (Address_NoSegwitAddressFromStringTest_Test *this)

{
  bool bVar1;
  pointer __dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_1;
  Address address;
  string local_348;
  AssertHelper local_320;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_318;
  undefined1 local_310 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300;
  char local_2f0 [16];
  pointer local_2e0;
  pointer local_2c8;
  pointer local_2b0;
  TapBranch local_298;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_220;
  Script local_208;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c8;
  Address local_198;
  
  cfd::core::Address::Address(&local_198);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn","");
      cfd::core::Address::Address((Address *)local_310,&local_348);
      cfd::core::Address::operator=(&local_198,(Address *)local_310);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1c8);
      cfd::core::Script::~Script(&local_208);
      local_298._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_220);
      cfd::core::TapBranch::~TapBranch(&local_298);
      if (local_2b0 != (pointer)0x0) {
        operator_delete(local_2b0);
      }
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if ((char *)local_300._M_allocated_capacity != local_2f0) {
        operator_delete((void *)local_300._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x183,
               "Expected: (address = Address(\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_310,&local_198);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn\"",
             "address.GetAddress().c_str()","1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn",(char *)local_310);
  if (local_310 != (undefined1  [8])&local_300) {
    operator_delete((void *)local_310);
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_310);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x185,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = local_348._M_dataplus._M_p & 0xffffffff00000000;
  local_320.data_._0_4_ = local_198.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_310,"NetType::kMainnet","address.GetNetType()",(NetType *)&local_348,
             (NetType *)&local_320);
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_308.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_308.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x186,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
      local_348._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 2;
  local_320.data_._0_4_ = local_198.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_310,"AddressType::kP2pkhAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_320);
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_308.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_308.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x187,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
      local_348._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 0xffffffff;
  local_320.data_._0_4_ = local_198.witness_ver_;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)local_310,"WitnessVersion::kVersionNone","address.GetWitnessVersion()",
             (WitnessVersion *)&local_348,(WitnessVersion *)&local_320);
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_308.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_308.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x188,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
      local_348._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  uVar3 = (long)local_198.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_198.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar3);
  }
  local_348.field_2._M_allocated_capacity = (size_type)(__dest + uVar3);
  sVar4 = (long)local_198.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_198.hash_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_348._M_dataplus._M_p = __dest;
  if (sVar4 != 0) {
    local_348._M_string_length = (size_type)__dest;
    memmove(__dest,local_198.hash_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar4);
  }
  local_348._M_string_length = (size_type)(__dest + sVar4);
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_310,(ByteData *)&local_348);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_320,"\"925d4028880bd0c9d68fbc7fc7dfee976698629c\"",
             "address.GetHash().GetHex().c_str()","925d4028880bd0c9d68fbc7fc7dfee976698629c",
             (char *)local_310);
  if (local_310 != (undefined1  [8])&local_300) {
    operator_delete((void *)local_310);
  }
  if (local_348._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (local_320.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_310);
    if (local_318.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x18a,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = (pointer)0x0;
  local_348._M_string_length = 0;
  local_348.field_2._M_allocated_capacity = 0;
  uVar3 = (long)local_198.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_198.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar3 == 0) {
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
  }
  else {
    if ((long)uVar3 < 0) {
      std::__throw_bad_alloc();
    }
    paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)operator_new(uVar3);
  }
  local_348.field_2._M_allocated_capacity = uVar3 + (long)paVar2;
  sVar4 = (long)local_198.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_198.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_348._M_dataplus._M_p = (pointer)paVar2;
  if (sVar4 != 0) {
    local_348._M_string_length = (size_type)paVar2;
    memmove(paVar2,local_198.pubkey_.data_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar4);
  }
  local_348._M_string_length = (long)paVar2 + sVar4;
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_310,(Pubkey *)&local_348);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_320,"\"\"","address.GetPubkey().GetHex().c_str()","",
             (char *)local_310);
  if (local_310 != (undefined1  [8])&local_300) {
    operator_delete((void *)local_310);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  if (local_320.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_310);
    if (local_318.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x18b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Script::Script((Script *)local_310,&local_198.redeem_script_);
  cfd::core::Script::GetHex_abi_cxx11_(&local_348,(Script *)local_310);
  pcVar5 = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_320,"\"\"","address.GetScript().GetHex().c_str()","",
             local_348._M_dataplus._M_p);
  paVar2 = &local_348.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != paVar2) {
    operator_delete(local_348._M_dataplus._M_p);
  }
  cfd::core::Script::~Script((Script *)local_310);
  if (local_320.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)local_310);
    if (local_318.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = ((local_318.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x18c,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_318,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc","");
      cfd::core::Address::Address((Address *)local_310,&local_348);
      cfd::core::Address::operator=(&local_198,(Address *)local_310);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1c8);
      cfd::core::Script::~Script(&local_208);
      local_298._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_220);
      cfd::core::TapBranch::~TapBranch(&local_298);
      if (local_2b0 != (pointer)0x0) {
        operator_delete(local_2b0);
      }
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if ((char *)local_300._M_allocated_capacity != local_2f0) {
        operator_delete((void *)local_300._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x18e,
               "Expected: (address = Address(\"mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_310,&local_198);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc\"",
             "address.GetAddress().c_str()","mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc",(char *)local_310);
  if (local_310 != (undefined1  [8])&local_300) {
    operator_delete((void *)local_310);
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_310);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,400,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 1;
  local_320.data_._0_4_ = local_198.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_310,"NetType::kTestnet","address.GetNetType()",(NetType *)&local_348,
             (NetType *)&local_320);
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_308.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_308.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x191,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
      local_348._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 2;
  local_320.data_._0_4_ = local_198.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_310,"AddressType::kP2pkhAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_320);
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_308.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_308.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x192,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_348._M_dataplus._M_p + 8))();
      }
      local_348._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG","");
      cfd::core::Address::Address((Address *)local_310,&local_348);
      cfd::core::Address::operator=(&local_198,(Address *)local_310);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1c8);
      cfd::core::Script::~Script(&local_208);
      local_298._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_220);
      cfd::core::TapBranch::~TapBranch(&local_298);
      if (local_2b0 != (pointer)0x0) {
        operator_delete(local_2b0);
      }
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if ((char *)local_300._M_allocated_capacity != local_2f0) {
        operator_delete((void *)local_300._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x197,
               "Expected: (address = Address(\"3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_310,&local_198);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG\"",
             "address.GetAddress().c_str()","3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG",(char *)local_310);
  if (local_310 != (undefined1  [8])&local_300) {
    operator_delete((void *)local_310);
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_310);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x199,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p = local_348._M_dataplus._M_p & 0xffffffff00000000;
  local_320.data_._0_4_ = local_198.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_310,"NetType::kMainnet","address.GetNetType()",(NetType *)&local_348,
             (NetType *)&local_320);
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_308.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_308.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x19a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
      local_348._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 1;
  local_320.data_._0_4_ = local_198.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_310,"AddressType::kP2shAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_320);
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_308.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_308.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x19b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_348._M_dataplus._M_p + 8))();
      }
      local_348._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_348._M_dataplus._M_p = (pointer)paVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU","");
      cfd::core::Address::Address((Address *)local_310,&local_348);
      cfd::core::Address::operator=(&local_198,(Address *)local_310);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_1c8);
      cfd::core::Script::~Script(&local_208);
      local_298._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
      std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
                (&local_220);
      cfd::core::TapBranch::~TapBranch(&local_298);
      if (local_2b0 != (pointer)0x0) {
        operator_delete(local_2b0);
      }
      if (local_2c8 != (pointer)0x0) {
        operator_delete(local_2c8);
      }
      if (local_2e0 != (pointer)0x0) {
        operator_delete(local_2e0);
      }
      if ((char *)local_300._M_allocated_capacity != local_2f0) {
        operator_delete((void *)local_300._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != paVar2) {
        operator_delete(local_348._M_dataplus._M_p);
      }
    }
  }
  else {
    testing::Message::Message((Message *)local_310);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_348,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x19d,
               "Expected: (address = Address(\"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU\")) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_310,&local_198);
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_348,"\"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU\"",
             "address.GetAddress().c_str()","2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU",(char *)local_310)
  ;
  if (local_310 != (undefined1  [8])&local_300) {
    operator_delete((void *)local_310);
  }
  if ((char)local_348._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)local_310);
    if ((undefined8 *)local_348._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_348._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x19f,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)local_310);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if (local_310 != (undefined1  [8])0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
        (**(code **)(*(size_type *)local_310 + 8))();
      }
      local_310 = (undefined1  [8])0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_348._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 1;
  local_320.data_._0_4_ = local_198.type_;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)local_310,"NetType::kTestnet","address.GetNetType()",(NetType *)&local_348,
             (NetType *)&local_320);
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_308.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_308.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1a0,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if ((long *)local_348._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_348._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_348._M_dataplus._M_p + 8))();
      }
      local_348._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_348._M_dataplus._M_p._0_4_ = 1;
  local_320.data_._0_4_ = local_198.addr_type_;
  testing::internal::CmpHelperEQ<cfd::core::AddressType,cfd::core::AddressType>
            ((internal *)local_310,"AddressType::kP2shAddress","address.GetAddressType()",
             (AddressType *)&local_348,(AddressType *)&local_320);
  if (local_310[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_348);
    if (local_308.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_308.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_320,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
               ,0x1a1,pcVar5);
    testing::internal::AssertHelper::operator=(&local_320,(Message *)&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_348._M_dataplus._M_p + 8))();
      }
      local_348._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_308,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_348._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_348,"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHXfHU","");
    cfd::core::Address::Address((Address *)local_310,&local_348);
    cfd::core::Address::operator=(&local_198,(Address *)local_310);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_1c8);
    cfd::core::Script::~Script(&local_208);
    local_298._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_006a68b0;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_220);
    cfd::core::TapBranch::~TapBranch(&local_298);
    if (local_2b0 != (pointer)0x0) {
      operator_delete(local_2b0);
    }
    if (local_2c8 != (pointer)0x0) {
      operator_delete(local_2c8);
    }
    if (local_2e0 != (pointer)0x0) {
      operator_delete(local_2e0);
    }
    if ((char *)local_300._M_allocated_capacity != local_2f0) {
      operator_delete((void *)local_300._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_348._M_dataplus._M_p != paVar2) {
      operator_delete(local_348._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)local_310);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_348,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_address.cpp"
             ,0x1a5,
             "Expected: (address = Address(\"2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHXfHU\")) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_348,(Message *)local_310);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_348);
  if (local_310 != (undefined1  [8])0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && (local_310 != (undefined1  [8])0x0)) {
      (**(code **)(*(size_type *)local_310 + 8))();
    }
    local_310 = (undefined1  [8])0x0;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_198.format_data_);
  cfd::core::Script::~Script(&local_198.redeem_script_);
  local_198.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_006a68b0;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_198.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_198.script_tree_.super_TapBranch);
  if (local_198.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_198.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198.address_._M_dataplus._M_p != &local_198.address_.field_2) {
    operator_delete(local_198.address_._M_dataplus._M_p);
  }
  return;
}

Assistant:

TEST(Address, NoSegwitAddressFromStringTest) {
  Address address;
  // P2PKH
  EXPECT_NO_THROW((address = Address("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn")));
  EXPECT_STREQ("1ELuNB5fLNUcrLzb93oJDPmjxjnsVwhNHn",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2pkhAddress, address.GetAddressType());
  EXPECT_EQ(WitnessVersion::kVersionNone, address.GetWitnessVersion());
  EXPECT_STREQ("925d4028880bd0c9d68fbc7fc7dfee976698629c",
               address.GetHash().GetHex().c_str());
  EXPECT_STREQ("", address.GetPubkey().GetHex().c_str());
  EXPECT_STREQ("", address.GetScript().GetHex().c_str());

  EXPECT_NO_THROW((address = Address("mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc")));
  EXPECT_STREQ("mtrrfEAe9PusdTUCrcmg3Jz4pjPaSnTiCc",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2pkhAddress, address.GetAddressType());

  // regtest prefix is equals testnet prefix

  // P2SH
  EXPECT_NO_THROW((address = Address("3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG")));
  EXPECT_STREQ("3K4cCA6U45jhvBcgc8qEdjHGDGyUMuVRpG",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kMainnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2shAddress, address.GetAddressType());

  EXPECT_NO_THROW((address = Address("2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU")));
  EXPECT_STREQ("2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHNfHU",
               address.GetAddress().c_str());
  EXPECT_EQ(NetType::kTestnet, address.GetNetType());
  EXPECT_EQ(AddressType::kP2shAddress, address.GetAddressType());

  // Illegal data
  EXPECT_THROW((address = Address("2NAcpFu2VfYF47yFEHGT7FgGXRdBeBHXfHU")),
               CfdException);
}